

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onb.h
# Opt level: O2

vec3 * random_cosine_direction(void)

{
  vec3 *in_RDI;
  double dVar1;
  double __x;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = random_double();
  __x = random_double();
  dVar2 = 1.0 - __x;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar3 = cos(dVar1 * 6.283185307179586);
  dVar4 = SQRT(__x);
  dVar5 = dVar4;
  if (__x < 0.0) {
    dVar5 = sqrt(__x);
  }
  dVar1 = sin(dVar1 * 6.283185307179586);
  if (__x < 0.0) {
    dVar4 = sqrt(__x);
  }
  in_RDI->e[0] = dVar3 * dVar5;
  in_RDI->e[1] = dVar1 * dVar4;
  in_RDI->e[2] = dVar2;
  return in_RDI;
}

Assistant:

inline vec3 random_cosine_direction() {
    auto r1 = random_double();
    auto r2 = random_double();
    auto z = sqrt(1 - r2);

    auto phi = 2 * pi * r1;
    auto x = cos(phi) * sqrt(r2);
    auto y = sin(phi) * sqrt(r2);

    return vec3(x, y, z);
}